

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O0

OpLayoutT_Uint16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> * __thiscall
Js::ByteCodeReader::
GetLayout<Js::OpLayoutT_Uint16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
          (ByteCodeReader *this,byte **ip)

{
  OpLayoutT_Uint16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *pOVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  byte *layoutData;
  size_t layoutSize;
  byte **ip_local;
  ByteCodeReader *this_local;
  
  pOVar1 = (OpLayoutT_Uint16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *)*ip;
  *ip = *ip + 4;
  this->m_currentLocation = *ip;
  if (this->m_endLocation < this->m_currentLocation) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x3f,"(m_currentLocation <= m_endLocation)",
                                "m_currentLocation <= m_endLocation");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return pOVar1;
}

Assistant:

const unaligned LayoutType * ByteCodeReader::GetLayout(const byte*& ip)
    {
        size_t layoutSize = sizeof(LayoutType);

        AssertMsg((layoutSize > 0) && (layoutSize < 100), "Ensure valid layout size");

        const byte * layoutData = ip;
        ip += layoutSize;
        m_currentLocation = ip;

        Assert(m_currentLocation <= m_endLocation);

        return reinterpret_cast<const unaligned LayoutType *>(layoutData);
    }